

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O2

string * __thiscall
t_haxe_generator::declare_field_abi_cxx11_
          (string *__return_storage_ptr__,t_haxe_generator *this,t_field *tfield,bool init)

{
  char cVar1;
  t_const_value *value;
  undefined8 *puVar2;
  t_type *type;
  string in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string result;
  string local_250 [32];
  ofstream dummy;
  
  std::operator+(&local_290,"var ",&tfield->name_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,
                 &local_290," : ");
  type = (t_type *)0x0;
  type_name_abi_cxx11_((string *)&stack0xfffffffffffffd50,this,tfield->type_,false,false);
  std::operator+(&result,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &stack0xfffffffffffffd50);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd50);
  std::__cxx11::string::~string((string *)&dummy);
  std::__cxx11::string::~string((string *)&local_290);
  if (init) {
    value = (t_const_value *)t_type::get_true_type(tfield->type_);
    cVar1 = (**(code **)(*(long *)&(value->mapVal_)._M_t._M_impl + 0x28))(value);
    if ((cVar1 == '\0') || (tfield->value_ == (t_const_value *)0x0)) {
      cVar1 = (**(code **)(*(long *)&(value->mapVal_)._M_t._M_impl + 0x28))(value);
      if (cVar1 == '\0') {
        cVar1 = (**(code **)(*(long *)&(value->mapVal_)._M_t._M_impl + 0x50))(value);
        if (cVar1 == '\0') {
          cVar1 = (**(code **)(*(long *)&(value->mapVal_)._M_t._M_impl + 0x68))(value);
          if (cVar1 == '\0') {
            type_name_abi_cxx11_
                      ((string *)&stack0xfffffffffffffd50,this,(t_type *)value,false,false);
            std::operator+(&local_290," = new ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stack0xfffffffffffffd50);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &dummy,&local_290,"()");
            std::__cxx11::string::append((string *)&result);
          }
          else {
            type_name_abi_cxx11_
                      ((string *)&stack0xfffffffffffffd50,this,(t_type *)value,false,false);
            std::operator+(&local_290," = new ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stack0xfffffffffffffd50);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &dummy,&local_290,"()");
            std::__cxx11::string::append((string *)&result);
          }
          std::__cxx11::string::~string((string *)&dummy);
          std::__cxx11::string::~string((string *)&local_290);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffd50);
        }
        else {
          std::__cxx11::string::append((char *)&result);
        }
      }
      else {
        switch(*(undefined4 *)&(value->identifierVal_).field_2) {
        case 0:
          puVar2 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar2 = "NO T_VOID CONSTRUCT";
          __cxa_throw(puVar2,&char_const*::typeinfo,0);
        case 1:
          break;
        case 2:
          break;
        case 3:
        case 4:
        case 5:
        case 6:
          break;
        case 7:
          break;
        default:
          goto switchD_001e8817_default;
        }
        std::__cxx11::string::append((char *)&result);
      }
    }
    else {
      std::ofstream::ofstream(&dummy);
      std::__cxx11::string::string(local_250,(string *)&tfield->name_);
      render_const_value((string *)&stack0xfffffffffffffd50,this,
                         &dummy.super_basic_ostream<char,_std::char_traits<char>_>,
                         in_stack_fffffffffffffd48,type,value);
      std::operator+(&local_290," = ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffd50);
      std::__cxx11::string::append((string *)&result);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd50);
      std::__cxx11::string::~string(local_250);
      std::ofstream::~ofstream(&dummy);
    }
  }
switchD_001e8817_default:
  std::operator+(__return_storage_ptr__,&result,";");
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

string t_haxe_generator::declare_field(t_field* tfield, bool init) {
  // TODO(mcslee): do we ever need to initialize the field?
  string result = "var " + tfield->get_name() + " : " + type_name(tfield->get_type());
  if (init) {
    t_type* ttype = get_true_type(tfield->get_type());
    if (ttype->is_base_type() && tfield->get_value() != nullptr) {
      std::ofstream dummy;
      result += " = " + render_const_value(dummy, tfield->get_name(), ttype, tfield->get_value());
    } else if (ttype->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)ttype)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "NO T_VOID CONSTRUCT";
      case t_base_type::TYPE_STRING:
        result += " = null";
        break;
      case t_base_type::TYPE_BOOL:
        result += " = false";
        break;
      case t_base_type::TYPE_I8:
      case t_base_type::TYPE_I16:
      case t_base_type::TYPE_I32:
      case t_base_type::TYPE_I64:
        result += " = 0";
        break;
      case t_base_type::TYPE_DOUBLE:
        result += " = (double)0";
        break;
      }

    } else if (ttype->is_enum()) {
      result += " = 0";
    } else if (ttype->is_container()) {
      result += " = new " + type_name(ttype, false, true) + "()";
    } else {
      result += " = new " + type_name(ttype, false, true) + "()";
    }
  }
  return result + ";";
}